

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O2

Status __thiscall
flatbuffers::anon_unknown_28::KotlinKMPCodeGenerator::GenerateCode
          (KotlinKMPCodeGenerator *this,Parser *parser,string *path,string *filename)

{
  bool bVar1;
  KotlinKMPGenerator generator;
  KotlinKMPGenerator local_210;
  
  kotlin::KotlinKMPGenerator::KotlinKMPGenerator(&local_210,parser,path,filename);
  bVar1 = kotlin::KotlinKMPGenerator::generate(&local_210);
  kotlin::KotlinKMPGenerator::~KotlinKMPGenerator(&local_210);
  return (Status)!bVar1;
}

Assistant:

Status GenerateCode(const Parser &parser, const std::string &path,
                      const std::string &filename) override {
    if (!GenerateKotlinKMP(parser, path, filename)) { return Status::ERROR; }
    return Status::OK;
  }